

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

bool FIX::DoubleConvertor::convert(string *value,double *result)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t total_length;
  int processed_chars;
  bool haveDigit;
  char *i;
  double *result_local;
  string *value_local;
  
  i = (char *)result;
  result_local = (double *)value;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  if (*pcVar2 == '\0') {
    value_local._7_1_ = false;
  }
  else {
    _processed_chars = pcVar2;
    if ((*pcVar2 == '-') && (_processed_chars = pcVar2 + 1, pcVar2[1] == '\0')) {
      value_local._7_1_ = false;
    }
    else {
      total_length._7_1_ = '\0';
      if ((int)*_processed_chars - 0x30U < 10) {
        total_length._7_1_ = '\x01';
        do {
          pcVar3 = _processed_chars + 1;
          pcVar2 = _processed_chars + 1;
          _processed_chars = pcVar3;
        } while ((int)*pcVar2 - 0x30U < 10);
      }
      if ((*_processed_chars == '.') &&
         (pcVar3 = _processed_chars + 1, pcVar2 = _processed_chars + 1, _processed_chars = pcVar3,
         (int)*pcVar2 - 0x30U < 10)) {
        total_length._7_1_ = '\x01';
        do {
          pcVar3 = _processed_chars + 1;
          pcVar2 = _processed_chars + 1;
          _processed_chars = pcVar3;
        } while ((int)*pcVar2 - 0x30U < 10);
      }
      if ((*_processed_chars == '\0') && (total_length._7_1_ != '\0')) {
        iVar1 = std::__cxx11::string::length();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        uVar4 = FIX::DoubleConvertor::fast_strtod(pcVar2,iVar1,(int *)&total_length);
        *(undefined8 *)i = uVar4;
        value_local._7_1_ = true;
      }
      else {
        value_local._7_1_ = false;
      }
    }
  }
  return value_local._7_1_;
}

Assistant:

static bool convert(const std::string &value, double &result) {
    const char *i = value.c_str();

    // Catch null strings
    if (!*i) {
      return false;
    }
    // Eat leading '-' and recheck for null string
    if (*i == '-' && !*++i) {
      return false;
    }

    bool haveDigit = false;

    if (IS_DIGIT(*i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i == '.' && IS_DIGIT(*++i)) {
      haveDigit = true;
      while (IS_DIGIT(*++i))
        ;
    }

    if (*i || !haveDigit) {
      return false;
    }

    int processed_chars;
    const size_t total_length = value.length();
    result = fast_strtod(value.c_str(), static_cast<int>(total_length), &processed_chars);

    return true;
  }